

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

Vec_Int_t * Fra_ImpDerive(Fra_Man_t *p,int nImpMaxLimit,int nImpUseLimit,int fLatchCorr)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  void *__ptr;
  int *piVar6;
  abctime aVar7;
  void *pTemp;
  abctime clk;
  int local_88;
  int CostRange;
  int Imp;
  int k;
  int i;
  int CostMax;
  int CostMin;
  int nImpsCollected;
  int nImpsComb;
  int nImpsNonSeq;
  int nImpsTried;
  int nImpsTotal;
  int *pNodesK;
  int *pNodesI;
  int *pImpCosts;
  Vec_Ptr_t *vNodes;
  Vec_Int_t *vTemp;
  Vec_Int_t *vImps;
  Fra_Sml_t *pComb;
  Fra_Sml_t *pSeq;
  int nSimWords;
  int fLatchCorr_local;
  int nImpUseLimit_local;
  int nImpMaxLimit_local;
  Fra_Man_t *p_local;
  
  pSeq._0_4_ = 0x40;
  nImpsNonSeq = 0;
  nImpsComb = 0;
  nImpsCollected = 0;
  CostMin = 0;
  CostMax = 0;
  i = 1000000000;
  k = 0;
  pSeq._4_4_ = fLatchCorr;
  nSimWords = nImpUseLimit;
  fLatchCorr_local = nImpMaxLimit;
  _nImpUseLimit_local = p;
  aVar5 = Abc_Clock();
  iVar2 = Aig_ManObjNumMax(_nImpUseLimit_local->pManAig);
  if (0x7fff < iVar2) {
    __assert_fail("Aig_ManObjNumMax(p->pManAig) < (1 << 15)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                  ,0x14c,"Vec_Int_t *Fra_ImpDerive(Fra_Man_t *, int, int, int)");
  }
  if (((fLatchCorr_local < 1) || (nSimWords < 1)) || (fLatchCorr_local < nSimWords)) {
    __assert_fail("nImpMaxLimit > 0 && nImpUseLimit > 0 && nImpUseLimit <= nImpMaxLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                  ,0x14d,"Vec_Int_t *Fra_ImpDerive(Fra_Man_t *, int, int, int)");
  }
  vImps = (Vec_Int_t *)Fra_SmlSimulateComb(_nImpUseLimit_local->pManAig,(int)pSeq,0);
  pComb = Fra_SmlSimulateSeq(_nImpUseLimit_local->pManAig,_nImpUseLimit_local->pPars->nFramesP,
                             (int)pSeq,1,1);
  pImpCosts = &Fra_SmlSortUsingOnes(pComb,pSeq._4_4_)->nCap;
  for (CostRange = (int)pSeq << 5; iVar2 = CostRange, 0 < CostRange; CostRange = CostRange + -1) {
    while (Imp = iVar2 + -1, 0 < Imp) {
      for (pNodesK = (int *)Vec_PtrEntry((Vec_Ptr_t *)pImpCosts,Imp); iVar2 = Imp, *pNodesK != 0;
          pNodesK = pNodesK + 1) {
        for (_nImpsTried = (int *)Vec_PtrEntry((Vec_Ptr_t *)pImpCosts,CostRange); *_nImpsTried != 0;
            _nImpsTried = _nImpsTried + 1) {
          nImpsNonSeq = nImpsNonSeq + 1;
        }
      }
    }
  }
  pNodesI = (int *)malloc((long)fLatchCorr_local << 2);
  vTemp = Vec_IntAlloc(fLatchCorr_local);
  for (CostRange = pComb->nWordsTotal << 5; iVar2 = CostRange, 0 < CostRange;
      CostRange = CostRange + -1) {
    while (Imp = iVar2 + -1, 0 < Imp) {
      for (pNodesK = (int *)Vec_PtrEntry((Vec_Ptr_t *)pImpCosts,Imp); iVar2 = Imp, *pNodesK != 0;
          pNodesK = pNodesK + 1) {
        for (_nImpsTried = (int *)Vec_PtrEntry((Vec_Ptr_t *)pImpCosts,CostRange); *_nImpsTried != 0;
            _nImpsTried = _nImpsTried + 1) {
          nImpsComb = nImpsComb + 1;
          iVar2 = Sml_NodeCheckImp(pComb,*pNodesK,*_nImpsTried);
          if (iVar2 == 0) {
            nImpsCollected = nImpsCollected + 1;
          }
          else {
            iVar2 = Sml_NodeCheckImp((Fra_Sml_t *)vImps,*pNodesK,*_nImpsTried);
            if (iVar2 == 0) {
              CostMax = CostMax + 1;
              local_88 = Fra_ImpCreate(*pNodesK,*_nImpsTried);
              iVar3 = Sml_NodeNotImpWeight((Fra_Sml_t *)vImps,*pNodesK,*_nImpsTried);
              piVar6 = pNodesI;
              iVar4 = Vec_IntSize(vTemp);
              piVar1 = pNodesI;
              iVar2 = i;
              piVar6[iVar4] = iVar3;
              iVar3 = Vec_IntSize(vTemp);
              i = Abc_MinInt(iVar2,piVar1[iVar3]);
              piVar6 = pNodesI;
              iVar2 = k;
              iVar3 = Vec_IntSize(vTemp);
              k = Abc_MaxInt(iVar2,piVar6[iVar3]);
              Vec_IntPush(vTemp,local_88);
              iVar2 = Vec_IntSize(vTemp);
              if (iVar2 == fLatchCorr_local) goto LAB_0081483e;
            }
            else {
              CostMin = CostMin + 1;
            }
          }
        }
      }
    }
  }
LAB_0081483e:
  Fra_SmlStop((Fra_Sml_t *)vImps);
  Fra_SmlStop(pComb);
  clk._4_4_ = i;
  iVar2 = Vec_IntSize(vTemp);
  if (nSimWords < iVar2) {
    vNodes = (Vec_Ptr_t *)vTemp;
    vTemp = Fra_SmlSelectMaxCost(vTemp,pNodesI,(int)pSeq << 5,nSimWords,(int *)((long)&clk + 4));
    Vec_IntFree((Vec_Int_t *)vNodes);
  }
  if (pNodesI != (int *)0x0) {
    free(pNodesI);
    pNodesI = (int *)0x0;
  }
  __ptr = Vec_PtrEntry((Vec_Ptr_t *)pImpCosts,0);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  Vec_PtrFree((Vec_Ptr_t *)pImpCosts);
  piVar6 = Vec_IntArray(vTemp);
  iVar2 = Vec_IntSize(vTemp);
  qsort(piVar6,(long)iVar2,4,Sml_CompareMaxId);
  if (_nImpUseLimit_local->pPars->fVerbose != 0) {
    printf("Implications: All = %d. Try = %d. NonSeq = %d. Comb = %d. Res = %d.\n",
           (ulong)(uint)nImpsNonSeq,(ulong)(uint)nImpsComb,(ulong)(uint)nImpsCollected,
           (ulong)(uint)CostMin,(ulong)(uint)CostMax);
    printf("Implication weight: Min = %d. Pivot = %d. Max = %d.   ",(ulong)(uint)i,(ulong)clk._4_4_,
           (ulong)(uint)k);
    Abc_Print(1,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar5) * 1.0) / 1000000.0);
  }
  return vTemp;
}

Assistant:

Vec_Int_t * Fra_ImpDerive( Fra_Man_t * p, int nImpMaxLimit, int nImpUseLimit, int fLatchCorr )
{
    int nSimWords = 64;
    Fra_Sml_t * pSeq, * pComb;
    Vec_Int_t * vImps, * vTemp;
    Vec_Ptr_t * vNodes;
    int * pImpCosts, * pNodesI, * pNodesK;
    int nImpsTotal = 0, nImpsTried = 0, nImpsNonSeq = 0, nImpsComb = 0, nImpsCollected = 0;
    int CostMin = ABC_INFINITY, CostMax = 0;
    int i, k, Imp, CostRange;
    abctime clk = Abc_Clock();
    assert( Aig_ManObjNumMax(p->pManAig) < (1 << 15) );
    assert( nImpMaxLimit > 0 && nImpUseLimit > 0 && nImpUseLimit <= nImpMaxLimit );
    // normalize both managers
    pComb = Fra_SmlSimulateComb( p->pManAig, nSimWords, 0 );
    pSeq = Fra_SmlSimulateSeq( p->pManAig, p->pPars->nFramesP, nSimWords, 1, 1 );
    // get the nodes sorted by the number of 1s
    vNodes = Fra_SmlSortUsingOnes( pSeq, fLatchCorr );
    // count the total number of implications
    for ( k = nSimWords * 32; k > 0; k-- )
    for ( i = k - 1; i > 0; i-- )
    for ( pNodesI = (int *)Vec_PtrEntry( vNodes, i ); *pNodesI; pNodesI++ )
    for ( pNodesK = (int *)Vec_PtrEntry( vNodes, k ); *pNodesK; pNodesK++ )
        nImpsTotal++;

    // compute implications and their costs
    pImpCosts = ABC_ALLOC( int, nImpMaxLimit );
    vImps = Vec_IntAlloc( nImpMaxLimit );
    for ( k = pSeq->nWordsTotal * 32; k > 0; k-- )
        for ( i = k - 1; i > 0; i-- )
        {
            // HERE WE ARE MISSING SOME POTENTIAL IMPLICATIONS (with complement!)

            for ( pNodesI = (int *)Vec_PtrEntry( vNodes, i ); *pNodesI; pNodesI++ )
            for ( pNodesK = (int *)Vec_PtrEntry( vNodes, k ); *pNodesK; pNodesK++ )
            {
                nImpsTried++;
                if ( !Sml_NodeCheckImp(pSeq, *pNodesI, *pNodesK) )
                {
                    nImpsNonSeq++;
                    continue;
                }
                if ( Sml_NodeCheckImp(pComb, *pNodesI, *pNodesK) )
                {
                    nImpsComb++;
                    continue;
                }
                nImpsCollected++;
                Imp = Fra_ImpCreate( *pNodesI, *pNodesK );
                pImpCosts[ Vec_IntSize(vImps) ] = Sml_NodeNotImpWeight(pComb, *pNodesI, *pNodesK);
                CostMin = Abc_MinInt( CostMin, pImpCosts[ Vec_IntSize(vImps) ] );
                CostMax = Abc_MaxInt( CostMax, pImpCosts[ Vec_IntSize(vImps) ] );
                Vec_IntPush( vImps, Imp );
                if ( Vec_IntSize(vImps) == nImpMaxLimit )
                    goto finish;
            } 
        }
finish:
    Fra_SmlStop( pComb );
    Fra_SmlStop( pSeq );

    // select implications with the highest cost
    CostRange = CostMin;
    if ( Vec_IntSize(vImps) > nImpUseLimit )
    {
        vImps = Fra_SmlSelectMaxCost( vTemp = vImps, pImpCosts, nSimWords * 32, nImpUseLimit, &CostRange );
        Vec_IntFree( vTemp );  
    }

    // dealloc
    ABC_FREE( pImpCosts ); 
    {
    void * pTemp = Vec_PtrEntry(vNodes, 0);
    ABC_FREE( pTemp );
    }
    Vec_PtrFree( vNodes );
    // reorder implications topologically
    qsort( (void *)Vec_IntArray(vImps), (size_t)Vec_IntSize(vImps), sizeof(int), 
            (int (*)(const void *, const void *)) Sml_CompareMaxId );
if ( p->pPars->fVerbose )
{
printf( "Implications: All = %d. Try = %d. NonSeq = %d. Comb = %d. Res = %d.\n", 
    nImpsTotal, nImpsTried, nImpsNonSeq, nImpsComb, nImpsCollected );
printf( "Implication weight: Min = %d. Pivot = %d. Max = %d.   ", 
       CostMin, CostRange, CostMax );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    return vImps;
}